

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

bool __thiscall
FBehavior::CopyStringToArray(FBehavior *this,int arraynum,int index,int maxLength,char *string)

{
  ArrayInfo *pAVar1;
  ArrayInfo *array;
  char *string_local;
  int local_20;
  int maxLength_local;
  int index_local;
  int arraynum_local;
  FBehavior *this_local;
  
  if (((uint)arraynum < (uint)this->NumTotalArrays) && (-1 < index)) {
    pAVar1 = this->Arrays[arraynum];
    array = (ArrayInfo *)string;
    string_local._4_4_ = maxLength;
    local_20 = index;
    if ((int)(pAVar1->ArraySize - index) < maxLength) {
      string_local._4_4_ = pAVar1->ArraySize - index;
    }
    while (0 < string_local._4_4_) {
      pAVar1->Elements[local_20] = (int)(char)array->ArraySize;
      if ((char)array->ArraySize == '\0') {
        return true;
      }
      array = (ArrayInfo *)((long)&array->ArraySize + 1);
      string_local._4_4_ = string_local._4_4_ + -1;
      local_20 = local_20 + 1;
    }
    this_local._7_1_ = (char)array->ArraySize == '\0';
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool FBehavior::CopyStringToArray(int arraynum, int index, int maxLength, const char *string)
{
	 // false if the operation was incomplete or unsuccessful

	if ((unsigned)arraynum >= (unsigned)NumTotalArrays || index < 0)
		return false;
	const ArrayInfo *array = Arrays[arraynum];
	
	if ((signed)array->ArraySize - index < maxLength) maxLength = (signed)array->ArraySize - index;

	while (maxLength-- > 0)
	{
		array->Elements[index++] = *string;
		if (!(*string)) return true; // written terminating 0
		string++;
	}
	return !(*string); // return true if only terminating 0 was not written
}